

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int map_add(wally_map *map_in,uchar *key,size_t key_len,uchar *value,size_t value_len,
           _Bool take_value,_func_int_uchar_ptr_size_t *check_fn,_Bool ignore_dups)

{
  _Bool _Var1;
  int iVar2;
  uchar **dst;
  wally_map_item *new_item;
  size_t sStack_48;
  int ret;
  size_t is_found;
  _Bool ignore_dups_local;
  uchar *puStack_38;
  _Bool take_value_local;
  size_t value_len_local;
  uchar *value_local;
  size_t key_len_local;
  uchar *key_local;
  wally_map *map_in_local;
  
  is_found._6_1_ = ignore_dups;
  if (((((map_in == (wally_map *)0x0) || (key == (uchar *)0x0)) ||
       ((key != (uchar *)0x0) != (key_len != 0))) ||
      ((is_found._7_1_ = take_value, puStack_38 = (uchar *)value_len,
       value_len_local = (size_t)value, value_local = (uchar *)key_len, key_len_local = (size_t)key,
       key_local = (uchar *)map_in, check_fn != (_func_int_uchar_ptr_size_t *)0x0 &&
       (iVar2 = (*check_fn)(key,key_len), iVar2 != 0)))) ||
     ((value_len_local != 0) != (puStack_38 != (uchar *)0x0))) {
    map_in_local._4_4_ = -2;
  }
  else {
    map_in_local._4_4_ =
         wally_map_find((wally_map *)key_local,(uchar *)key_len_local,(size_t)value_local,
                        &stack0xffffffffffffffb8);
    if (map_in_local._4_4_ == 0) {
      if (sStack_48 == 0) {
        iVar2 = array_grow((void **)key_local,*(size_t *)(key_local + 8),
                           (size_t *)(key_local + 0x10),0x20);
        map_in_local._4_4_ = iVar2;
        if (iVar2 == 0) {
          dst = (uchar **)(*(long *)key_local + *(long *)(key_local + 8) * 0x20);
          _Var1 = clone_bytes(dst,(uchar *)key_len_local,(size_t)value_local);
          if (_Var1) {
            if (value_len_local != 0) {
              if ((is_found._7_1_ & 1) == 0) {
                _Var1 = clone_bytes(dst + 2,(uchar *)value_len_local,(size_t)puStack_38);
                if (!_Var1) {
                  clear_and_free(*dst,(size_t)value_local);
                  *dst = (uchar *)0x0;
                  return -3;
                }
              }
              else {
                dst[2] = (uchar *)value_len_local;
              }
            }
            dst[1] = value_local;
            dst[3] = puStack_38;
            *(long *)(key_local + 8) = *(long *)(key_local + 8) + 1;
          }
          else {
            map_in_local._4_4_ = -3;
          }
        }
      }
      else {
        if (((is_found._6_1_ & 1) != 0) && ((is_found._7_1_ & 1) != 0)) {
          clear_and_free((void *)value_len_local,(size_t)puStack_38);
        }
        map_in_local._4_4_ = -2;
        if ((is_found._6_1_ & 1) != 0) {
          map_in_local._4_4_ = 0;
        }
      }
    }
  }
  return map_in_local._4_4_;
}

Assistant:

static int map_add(struct wally_map *map_in,
                   const unsigned char *key, size_t key_len,
                   const unsigned char *value, size_t value_len,
                   bool take_value,
                   int (*check_fn)(const unsigned char *key, size_t key_len),
                   bool ignore_dups)
{
    size_t is_found;
    int ret;

    if (!map_in || !key || BYTES_INVALID(key, key_len) ||
        (check_fn && check_fn(key, key_len) != WALLY_OK) ||
        BYTES_INVALID(value, value_len))
        return WALLY_EINVAL;

    if ((ret = wally_map_find(map_in, key, key_len, &is_found)) != WALLY_OK)
        return ret;

    if (is_found) {
        if (ignore_dups && take_value)
            clear_and_free((unsigned char *)value, value_len);
        return ignore_dups ? WALLY_OK : WALLY_EINVAL;
    }

    ret = array_grow((void *)&map_in->items, map_in->num_items,
                     &map_in->items_allocation_len, sizeof(struct wally_map_item));
    if (ret == WALLY_OK) {
        struct wally_map_item *new_item = map_in->items + map_in->num_items;

        if (!clone_bytes(&new_item->key, key, key_len))
            return WALLY_ENOMEM;
        if (value) {
            if (take_value)
                new_item->value = (unsigned char *)value;
            else if (!clone_bytes(&new_item->value, value, value_len)) {
                clear_and_free(new_item->key, key_len);
                new_item->key = NULL;
                return WALLY_ENOMEM;
            }
        }
        new_item->key_len = key_len;
        new_item->value_len = value_len;
        map_in->num_items++;
    }
    return ret;
}